

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O2

RelationsMap * __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::getRelated
          (RelationsMap *__return_storage_ptr__,RelationsGraph<dg::vr::ValueRelations> *this,
          Bucket *start,Relations *relations,bool toFirstStrict)

{
  _Base_ptr p_Var1;
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  *__x;
  Relations augmented;
  RelationsMap result;
  _Base_bitset<1UL> local_68;
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  local_60;
  
  local_68._M_w = dg::vr::Relations::getAugmented((relations->bits).super__Base_bitset<1UL>._M_w);
  getAugmentedRelated((RelationsMap *)&local_60,this,start,(Relations *)&local_68,toFirstStrict);
  for (p_Var1 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &local_60._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    dg::vr::Relations::addImplied();
  }
  __x = &filterResult(relations,(RelationsMap *)&local_60)->_M_t;
  std::
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::_Rb_tree(&__return_storage_ptr__->_M_t,__x);
  std::
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

RelationsMap getRelated(const Bucket &start, const Relations &relations,
                            bool toFirstStrict = false) const {
        Relations augmented = Relations::getAugmented(relations);

        RelationsMap result =
                getAugmentedRelated(start, augmented, toFirstStrict);

        for (auto &pair : result) {
            pair.second.addImplied();
        }

        return filterResult(relations, result);
    }